

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

uchar * __thiscall Overlay_Window::read_image(Overlay_Window *this,int *ww,int *hh)

{
  Window WVar1;
  int iVar2;
  Window WVar3;
  Fl_Surface_Device *pFVar4;
  Fl_Display_Device *pFVar5;
  uchar *puVar6;
  Fl_Surface_Device *_ss;
  Window _sw;
  uchar *pixels;
  Fl_Offscreen offscreen;
  int *hh_local;
  int *ww_local;
  Overlay_Window *this_local;
  
  Fl_Window::make_current((Fl_Window *)this);
  iVar2 = Fl_Widget::w((Fl_Widget *)this);
  *ww = iVar2;
  iVar2 = Fl_Widget::h((Fl_Widget *)this);
  *hh = iVar2;
  WVar3 = XCreatePixmap(fl_display,
                        *(undefined8 *)
                         (*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10),*ww,*hh,
                        fl_visual->depth);
  WVar1 = fl_window;
  fl_window = WVar3;
  pFVar4 = Fl_Surface_Device::surface();
  pFVar5 = Fl_Display_Device::display_device();
  (*(pFVar5->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
  fl_push_no_clip();
  iVar2 = Fl_Window::shown((Fl_Window *)this);
  if (iVar2 == 0) {
    Fl_Widget::image((Fl_Widget *)this,Fl::scheme_bg_);
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  (*(this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget._vptr_Fl_Widget[2])();
  puVar6 = fl_read_image((uchar *)0x0,0,0,*ww,*hh,0);
  fl_pop_clip();
  fl_window = WVar1;
  (*(pFVar4->super_Fl_Device)._vptr_Fl_Device[3])();
  XFreePixmap(fl_display,WVar3);
  Fl_Window::make_current(main_window);
  return puVar6;
}

Assistant:

uchar *Overlay_Window::read_image(int &ww, int &hh) {
  // Create an off-screen buffer for the window...
  //main_window->make_current();
  make_current();

  ww = w();
  hh = h();

  Fl_Offscreen offscreen = fl_create_offscreen(ww, hh);
  uchar *pixels;

  // Redraw the window into the offscreen buffer...
  fl_begin_offscreen(offscreen);

  if (!shown()) image(Fl::scheme_bg_);

  redraw();
  draw();

  // Read the screen image...
  pixels = fl_read_image(0, 0, 0, ww, hh);

  fl_end_offscreen();

  // Cleanup and return...
  fl_delete_offscreen(offscreen);
  main_window->make_current();
  return pixels;
}